

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O2

void __thiscall Shell::FunctionDefinition::assignArgOccursData(FunctionDefinition *this,Def *updDef)

{
  TermList **ppTVar1;
  TermList *pTVar2;
  bool bVar3;
  int iVar4;
  bool *pbVar5;
  uint *puVar6;
  ulong uVar7;
  uint uVar8;
  uint64_t uVar9;
  Term *trm;
  anon_union_8_2_f154dc0f_for_Term_10 *paVar10;
  Term *elem;
  TermList *pTVar11;
  Def *d;
  uint local_3c;
  FunctionDefinition *local_38;
  
  uVar8 = *(uint *)&updDef->lhs->field_0xc;
  if ((uVar8 & 0xfffffff) == 0) {
    return;
  }
  local_38 = this;
  pbVar5 = (bool *)Lib::alloc((ulong)uVar8 & 0xfffffff);
  updDef->argOccurs = pbVar5;
  uVar8 = 0;
  memset(pbVar5,0,(ulong)(*(uint *)&updDef->lhs->field_0xc & 0xfffffff));
  if ((assignArgOccursData(Shell::FunctionDefinition::Def*)::var2argIndex == '\0') &&
     (iVar4 = __cxa_guard_acquire(&assignArgOccursData(Shell::FunctionDefinition::Def*)::
                                   var2argIndex), iVar4 != 0)) {
    assignArgOccursData::var2argIndex._timestamp = 1;
    assignArgOccursData::var2argIndex._size = 0;
    assignArgOccursData::var2argIndex._deleted = 0;
    assignArgOccursData::var2argIndex._capacityIndex = 0;
    assignArgOccursData::var2argIndex._capacity = 0;
    assignArgOccursData::var2argIndex._20_8_ = 0;
    assignArgOccursData::var2argIndex._28_8_ = 0;
    assignArgOccursData::var2argIndex._afterLast._4_4_ = 0;
    __cxa_atexit(Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
                 ,&assignArgOccursData::var2argIndex,&__dso_handle);
    __cxa_guard_release(&assignArgOccursData(Shell::FunctionDefinition::Def*)::var2argIndex);
  }
  Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
            (&assignArgOccursData::var2argIndex);
  for (paVar10 = (anon_union_8_2_f154dc0f_for_Term_10 *)
                 (updDef->lhs->_args + (*(uint *)&updDef->lhs->field_0xc & 0xfffffff));
      ((*paVar10)._vars & 3) != 2; paVar10 = paVar10 + -1) {
    Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::insert
              (&assignArgOccursData::var2argIndex,(uint)((ulong)*paVar10 >> 2),uVar8);
    uVar8 = uVar8 + 1;
  }
  elem = updDef->rhs;
  if ((assignArgOccursData(Shell::FunctionDefinition::Def*)::stack == '\0') &&
     (iVar4 = __cxa_guard_acquire(&assignArgOccursData(Shell::FunctionDefinition::Def*)::stack),
     iVar4 != 0)) {
    Lib::Stack<Kernel::TermList_*>::Stack(&assignArgOccursData::stack,4);
    __cxa_atexit(Lib::Stack<Kernel::TermList_*>::~Stack,&assignArgOccursData::stack,&__dso_handle);
    __cxa_guard_release(&assignArgOccursData(Shell::FunctionDefinition::Def*)::stack);
  }
  if ((assignArgOccursData(Shell::FunctionDefinition::Def*)::defArgStack == '\0') &&
     (iVar4 = __cxa_guard_acquire(&assignArgOccursData(Shell::FunctionDefinition::Def*)::defArgStack
                                 ), iVar4 != 0)) {
    Lib::Stack<Shell::FunctionDefinition::Def_*>::Stack(&assignArgOccursData::defArgStack,4);
    __cxa_atexit(Lib::Stack<Shell::FunctionDefinition::Def_*>::~Stack,
                 &assignArgOccursData::defArgStack,&__dso_handle);
    __cxa_guard_release(&assignArgOccursData(Shell::FunctionDefinition::Def*)::defArgStack);
  }
  if ((assignArgOccursData(Shell::FunctionDefinition::Def*)::termArgStack == '\0') &&
     (iVar4 = __cxa_guard_acquire(&assignArgOccursData(Shell::FunctionDefinition::Def*)::
                                   termArgStack), iVar4 != 0)) {
    Lib::Stack<Kernel::Term_*>::Stack(&assignArgOccursData::termArgStack,4);
    __cxa_atexit(Lib::Stack<Kernel::Term_*>::~Stack,&assignArgOccursData::termArgStack,&__dso_handle
                );
    __cxa_guard_release(&assignArgOccursData(Shell::FunctionDefinition::Def*)::termArgStack);
  }
  do {
    if (((ulong)elem & 3) == 0) {
      if ((*(uint *)&elem->field_0xc & 0xfffffff) != 0) {
        if ((elem->_args[0]._content & 0x20) == 0) {
          local_3c = elem->_functor;
          bVar3 = Lib::
                  DHMap<int,_Shell::FunctionDefinition::Def_*,_Lib::IdentityHash,_Lib::DefaultHash>
                  ::find(&local_38->_defs,(int *)&local_3c,&d);
          if ((!bVar3) || (d->mark == BLOCKED)) goto LAB_0054e260;
        }
        else {
LAB_0054e260:
          d = (Def *)0x0;
        }
        Lib::Stack<Kernel::TermList_*>::push
                  (&assignArgOccursData::stack,elem->_args + (*(uint *)&elem->field_0xc & 0xfffffff)
                  );
        Lib::Stack<Shell::FunctionDefinition::Def_*>::push(&assignArgOccursData::defArgStack,d);
        Lib::Stack<Kernel::Term_*>::push(&assignArgOccursData::termArgStack,elem);
      }
    }
    else if ((int)((ulong)elem & 3) == 2) {
      assignArgOccursData::defArgStack._cursor = assignArgOccursData::defArgStack._cursor + -1;
      assignArgOccursData::termArgStack._cursor = assignArgOccursData::termArgStack._cursor + -1;
    }
    else {
      pbVar5 = updDef->argOccurs;
      puVar6 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::get
                         (&assignArgOccursData::var2argIndex,(uint)((ulong)elem >> 2));
      pbVar5[*puVar6] = true;
    }
    if (assignArgOccursData::stack._cursor == assignArgOccursData::stack._stack) {
      return;
    }
    ppTVar1 = assignArgOccursData::stack._cursor + -1;
    pTVar11 = assignArgOccursData::stack._cursor[-1];
    uVar9 = pTVar11->_content;
    assignArgOccursData::stack._cursor = ppTVar1;
    if (((uint)uVar9 & 3) != 2) {
      if (assignArgOccursData::defArgStack._cursor[-1] == (Def *)0x0) {
LAB_0054e33d:
        Lib::Stack<Kernel::TermList_*>::push(&assignArgOccursData::stack,pTVar11 + -1);
      }
      else {
        uVar7 = (long)pTVar11 + (-0x28 - (long)assignArgOccursData::termArgStack._cursor[-1]);
        while (((uint)uVar9 & 3) != 2) {
          if (assignArgOccursData::defArgStack._cursor[-1]->argOccurs
              [(*(uint *)&assignArgOccursData::termArgStack._cursor[-1]->field_0xc & 0xfffffff) -
               (int)(uVar7 >> 3)] != false) goto LAB_0054e33d;
          pTVar2 = pTVar11 + -1;
          pTVar11 = pTVar11 + -1;
          uVar7 = uVar7 - 8;
          uVar9 = pTVar2->_content;
        }
      }
    }
    elem = (Term *)pTVar11->_content;
  } while( true );
}

Assistant:

void FunctionDefinition::assignArgOccursData(Def* updDef)
{
  ASS(!updDef->argOccurs);

  if(!updDef->lhs->arity()) {
    return;
  }

  updDef->argOccurs=reinterpret_cast<bool*>(ALLOC_KNOWN(updDef->lhs->arity()*sizeof(bool),
	    "FunctionDefinition::Def::argOccurs"));
  std::memset(updDef->argOccurs, 0, updDef->lhs->arity() * sizeof(bool));

  static DHMap<unsigned, unsigned, IdentityHash, DefaultHash> var2argIndex;
  var2argIndex.reset();
  int argIndex=0;
  for (TermList* ts = updDef->lhs->args(); ts->isNonEmpty(); ts=ts->next()) {
    int w = ts->var();
    var2argIndex.insert(w, argIndex);
    argIndex++;
  }

  TermList t=TermList(updDef->rhs);
  static Stack<TermList*> stack(4);
  static Stack<Def*> defArgStack(4);
  static Stack<Term*> termArgStack(4);
  for(;;) {
    Def* d;
    if(t.isEmpty()) {
      defArgStack.pop();
      termArgStack.pop();
    } else if(t.isTerm()) {
      Term* trm=t.term();
      if(trm->arity()) {
        if(trm->isSort() || !_defs.find(trm->functor(), d) || d->mark==Def::BLOCKED) {
          d=0;
        }
        ASS(!d || d->mark==Def::SAFE);
        stack.push(trm->args());
        defArgStack.push(d);
        termArgStack.push(trm);
      }
    } else {
      ASS(t.isOrdinaryVar());
      updDef->argOccurs[var2argIndex.get(t.var())]=true;
    }
    if(stack.isEmpty()) {
      break;
    }
    TermList* ts=stack.pop();
    if(!ts->isEmpty()) {
      Def* argDef=defArgStack.top();
      if(argDef) {
        Term* parentTerm=termArgStack.top();
        while(ts->isNonEmpty() && !argDef->argOccurs[parentTerm->getArgumentIndex(ts)]) {
          ts=ts->next();
        }
        if(ts->isNonEmpty()) {
          stack.push(ts->next());
        }
      } else {
        stack.push(ts->next());
      }
    }
    t=*ts;
  }
}